

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O0

void __thiscall TTD::FileWriter::WriteRawByteBuff_Fixed<unsigned_char>(FileWriter *this,uchar *data)

{
  byte *dst;
  byte *trgt;
  uchar *data_local;
  FileWriter *this_local;
  
  dst = ReserveSpaceForSmallData<1ul>(this);
  js_memcpy_s(dst,1,data,1);
  CommitSpaceForSmallData(this,1);
  return;
}

Assistant:

void WriteRawByteBuff_Fixed(const T& data)
        {
            byte* trgt = this->ReserveSpaceForSmallData<sizeof(T)>();

            js_memcpy_s(trgt, sizeof(T), (const byte*)(&data), sizeof(T));

            this->CommitSpaceForSmallData(sizeof(T));
        }